

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution1D_x86::forward(Convolution1D_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined4 uVar9;
  uint uVar10;
  _func_int *p_Var11;
  long lVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int *piVar21;
  void *pvVar22;
  byte bVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  float *pfVar30;
  ulong uVar31;
  float *pfVar32;
  int iVar33;
  ulong uVar34;
  void *pvVar35;
  void *pvVar36;
  int iVar37;
  long lVar38;
  float *pfVar39;
  long lVar40;
  int iVar41;
  int iVar42;
  uint uVar43;
  int iVar44;
  uint uVar45;
  float *pfVar46;
  uint uVar47;
  long lVar48;
  undefined4 *puVar49;
  int iVar50;
  undefined4 *puVar51;
  float *pfVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  bool bVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar63 [16];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 extraout_var_00 [12];
  undefined1 auVar66 [16];
  float fVar67;
  float fVar70;
  float fVar71;
  v4sf one;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined4 uVar86;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar87;
  undefined8 uVar88;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar97;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  int inh;
  int elempack;
  ulong local_1e8;
  long local_1d8;
  void *local_1d0;
  undefined1 (*local_1c0) [16];
  long local_1b8;
  ulong local_1a8;
  ulong local_198;
  ulong local_110;
  Mat local_f8;
  undefined1 local_a8 [8];
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined1 local_98 [8];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_88 [16];
  ulong local_70;
  long local_68;
  long local_60;
  void *local_58;
  long local_50;
  long local_48;
  void *local_40;
  ulong local_38;
  undefined1 extraout_var [12];
  
  uVar34 = bottom_blob->elemsize;
  iVar6 = bottom_blob->elempack;
  p_Var11 = this->_vptr_Convolution1D_x86[-3];
  iVar7 = *(int *)(&this->field_0xd4 + (long)p_Var11);
  iVar8 = *(int *)(&this->field_0xd8 + (long)p_Var11);
  local_f8.cstep = 0;
  local_f8.data = (void *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize._0_4_ = 0;
  local_f8.elemsize._4_4_ = 0;
  local_f8.elempack = 0;
  local_f8.allocator = (Allocator *)0x0;
  local_f8.dims = 0;
  local_f8.w = 0;
  local_f8.h = 0;
  local_f8.d = 0;
  local_f8.c = 0;
  Convolution1D::make_padding
            ((Convolution1D *)((long)&this->_vptr_Convolution1D_x86 + (long)p_Var11),bottom_blob,
             &local_f8,opt);
  iVar41 = -100;
  if ((local_f8.data != (void *)0x0) && ((long)local_f8.c * local_f8.cstep != 0)) {
    bVar23 = (*(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86[-3]) & 3) == 0 &
             opt->use_packing_layout;
    iVar50 = (uint)bVar23 + (uint)bVar23 * 2 + 1;
    Mat::create(top_blob,(~((iVar7 + -1) * iVar8) + local_f8.w) /
                         *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86[-3]) + 1,
                (int)*(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86[-3]) / iVar50
                ,uVar34 / (ulong)(long)iVar6 << bVar23 * '\x02',iVar50,opt->blob_allocator);
    iVar6 = local_f8.elempack;
    auVar93 = _DAT_005488e0;
    auVar92 = _DAT_005488d0;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      p_Var11 = this->_vptr_Convolution1D_x86[-3];
      iVar7 = *(int *)(&this->field_0xd4 + (long)p_Var11);
      uVar9 = *(undefined4 *)(&this->field_0xf4 + (long)p_Var11);
      iVar8 = *(int *)(&this->field_0xd8 + (long)p_Var11);
      lVar53 = (long)iVar8;
      iVar41 = *(int *)(&this->field_0xdc + (long)p_Var11);
      lVar38 = (long)iVar41;
      lVar12 = *(long *)(&this->field_0x190 + (long)p_Var11);
      uVar24 = local_f8.h * local_f8.elempack;
      iVar25 = local_f8.w * local_f8.elempack;
      uVar34 = (long)top_blob->h * (long)top_blob->elempack;
      iVar50 = (int)uVar34;
      iVar26 = iVar50 + 3;
      if (-1 < iVar50) {
        iVar26 = iVar50;
      }
      uVar10 = top_blob->w;
      uVar43 = iVar26 >> 2;
      lVar40 = (long)iVar25;
      if (3 < iVar50) {
        lVar48 = (long)top_blob->elempack * (long)(int)uVar10;
        iVar26 = (int)lVar48;
        lVar27 = (long)(iVar26 * 3);
        local_88._0_8_ = lVar27;
        local_1e8 = 0;
        fVar103 = (float)DAT_005488d0;
        fVar104 = DAT_005488d0._4_4_;
        fVar105 = DAT_005488d0._8_4_;
        fVar106 = DAT_005488d0._12_4_;
        fVar67 = (float)DAT_005488e0;
        fVar70 = DAT_005488e0._4_4_;
        fVar71 = DAT_005488e0._8_4_;
        do {
          lVar28 = (long)top_blob->w;
          if (0 < lVar28) {
            uVar47 = local_f8.h * local_f8.elempack;
            iVar33 = top_blob->elempack;
            local_1c0 = (undefined1 (*) [16])
                        ((int)((long)((ulong)(uint)((int)(local_1e8 * 4) >> 0x1f) << 0x20 |
                                     local_1e8 * 4 & 0xffffffff) / (long)iVar33) * lVar28 *
                         top_blob->elemsize + (long)top_blob->data);
            local_1b8 = 0;
            iVar44 = 0;
            lVar55 = 0;
            local_198 = lVar40 * 4;
            do {
              fVar111 = 0.0;
              fVar112 = 0.0;
              fVar113 = 0.0;
              fVar114 = 0.0;
              fVar97 = 0.0;
              fVar100 = 0.0;
              fVar101 = 0.0;
              fVar102 = 0.0;
              if (lVar12 != 0) {
                pfVar52 = (float *)(lVar12 + local_1e8 * 0x10);
                fVar97 = *pfVar52;
                fVar100 = pfVar52[1];
                fVar101 = pfVar52[2];
                fVar102 = pfVar52[3];
              }
              pfVar52 = (float *)((this->weight_data_tm).cstep * local_1e8 *
                                  (this->weight_data_tm).elemsize +
                                 (long)(this->weight_data_tm).data);
              uVar31 = 0;
              if ((int)uVar47 < 4) {
                fVar87 = 0.0;
                fVar94 = 0.0;
                fVar95 = 0.0;
                fVar96 = 0.0;
                fVar107 = 0.0;
                fVar108 = 0.0;
                fVar109 = 0.0;
                fVar110 = 0.0;
              }
              else {
                fVar107 = 0.0;
                fVar108 = 0.0;
                fVar109 = 0.0;
                fVar110 = 0.0;
                fVar87 = 0.0;
                fVar94 = 0.0;
                fVar95 = 0.0;
                fVar96 = 0.0;
                iVar42 = 0;
                do {
                  lVar29 = (long)(iVar42 / local_f8.elempack) *
                           (long)local_f8.w *
                           CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
                  if (local_f8.elempack == 4) {
                    if (0 < iVar7) {
                      pfVar30 = (float *)((long)local_f8.data + lVar29 + (long)iVar44 * 4);
                      iVar37 = iVar7;
                      do {
                        fVar1 = *pfVar30;
                        fVar2 = pfVar30[1];
                        fVar3 = pfVar30[2];
                        fVar4 = pfVar30[3];
                        fVar97 = fVar97 + fVar1 * *pfVar52;
                        fVar100 = fVar100 + fVar1 * pfVar52[1];
                        fVar101 = fVar101 + fVar1 * pfVar52[2];
                        fVar102 = fVar102 + fVar1 * pfVar52[3];
                        fVar107 = fVar107 + fVar2 * pfVar52[4];
                        fVar108 = fVar108 + fVar2 * pfVar52[5];
                        fVar109 = fVar109 + fVar2 * pfVar52[6];
                        fVar110 = fVar110 + fVar2 * pfVar52[7];
                        fVar87 = fVar87 + fVar3 * pfVar52[8];
                        fVar94 = fVar94 + fVar3 * pfVar52[9];
                        fVar95 = fVar95 + fVar3 * pfVar52[10];
                        fVar96 = fVar96 + fVar3 * pfVar52[0xb];
                        fVar111 = fVar111 + fVar4 * pfVar52[0xc];
                        fVar112 = fVar112 + fVar4 * pfVar52[0xd];
                        fVar113 = fVar113 + fVar4 * pfVar52[0xe];
                        fVar114 = fVar114 + fVar4 * pfVar52[0xf];
                        pfVar52 = pfVar52 + 0x10;
                        pfVar30 = pfVar30 + iVar8 * 4;
                        iVar37 = iVar37 + -1;
                      } while (iVar37 != 0);
                      goto LAB_004e1f84;
                    }
                  }
                  else {
                    pfVar30 = (float *)((long)local_f8.data +
                                       lVar29 + (long)(iVar41 * local_f8.elempack * (int)lVar55) * 4
                                       );
LAB_004e1f84:
                    if ((local_f8.elempack == 1) && (iVar37 = iVar7, 0 < iVar7)) {
                      do {
                        fVar1 = *pfVar30;
                        fVar97 = fVar97 + fVar1 * *pfVar52;
                        fVar100 = fVar100 + fVar1 * pfVar52[1];
                        fVar101 = fVar101 + fVar1 * pfVar52[2];
                        fVar102 = fVar102 + fVar1 * pfVar52[3];
                        fVar1 = pfVar30[lVar40];
                        fVar107 = fVar107 + fVar1 * pfVar52[4];
                        fVar108 = fVar108 + fVar1 * pfVar52[5];
                        fVar109 = fVar109 + fVar1 * pfVar52[6];
                        fVar110 = fVar110 + fVar1 * pfVar52[7];
                        fVar1 = pfVar30[iVar25 * 2];
                        fVar87 = fVar87 + fVar1 * pfVar52[8];
                        fVar94 = fVar94 + fVar1 * pfVar52[9];
                        fVar95 = fVar95 + fVar1 * pfVar52[10];
                        fVar96 = fVar96 + fVar1 * pfVar52[0xb];
                        fVar1 = pfVar30[iVar25 * 3];
                        fVar111 = fVar111 + fVar1 * pfVar52[0xc];
                        fVar112 = fVar112 + fVar1 * pfVar52[0xd];
                        fVar113 = fVar113 + fVar1 * pfVar52[0xe];
                        fVar114 = fVar114 + fVar1 * pfVar52[0xf];
                        pfVar52 = pfVar52 + 0x10;
                        pfVar30 = pfVar30 + lVar53;
                        iVar37 = iVar37 + -1;
                      } while (iVar37 != 0);
                    }
                  }
                  iVar37 = iVar42 + 7;
                  iVar42 = iVar42 + 4;
                } while (iVar37 < (int)uVar47);
                uVar31 = (ulong)uVar47 & 0xfffffffc;
              }
              uVar45 = (uint)uVar31;
              if ((int)(uVar45 | 1) < (int)uVar47) {
                lVar29 = (long)local_f8.w *
                         CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
                lVar56 = lVar29 * uVar31;
                lVar54 = (long)local_f8.data + lVar56 + local_198;
                lVar29 = lVar29 * 2;
                lVar56 = (long)local_f8.data + lVar56 + local_1b8;
                do {
                  if (0 < iVar7) {
                    lVar57 = 0;
                    iVar42 = iVar7;
                    do {
                      fVar1 = *(float *)(lVar56 + lVar57);
                      fVar97 = fVar97 + fVar1 * *pfVar52;
                      fVar100 = fVar100 + fVar1 * pfVar52[1];
                      fVar101 = fVar101 + fVar1 * pfVar52[2];
                      fVar102 = fVar102 + fVar1 * pfVar52[3];
                      fVar1 = *(float *)(lVar54 + lVar57);
                      fVar107 = fVar107 + fVar1 * pfVar52[4];
                      fVar108 = fVar108 + fVar1 * pfVar52[5];
                      fVar109 = fVar109 + fVar1 * pfVar52[6];
                      fVar110 = fVar110 + fVar1 * pfVar52[7];
                      pfVar52 = pfVar52 + 8;
                      lVar57 = lVar57 + lVar53 * 4;
                      iVar42 = iVar42 + -1;
                    } while (iVar42 != 0);
                  }
                  uVar31 = uVar31 + 2;
                  uVar45 = (uint)uVar31;
                  lVar54 = lVar54 + lVar29;
                  lVar56 = lVar56 + lVar29;
                } while ((int)(uVar45 | 1) < (int)uVar47);
              }
              if ((int)uVar45 < (int)uVar47) {
                lVar29 = (long)local_f8.w *
                         CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
                uVar31 = (ulong)uVar45;
                pfVar30 = (float *)(lVar29 * uVar31 + local_1b8 + (long)local_f8.data);
                do {
                  pfVar46 = pfVar30;
                  iVar42 = iVar7;
                  if (0 < iVar7) {
                    do {
                      fVar1 = *pfVar46;
                      fVar97 = fVar97 + fVar1 * *pfVar52;
                      fVar100 = fVar100 + fVar1 * pfVar52[1];
                      fVar101 = fVar101 + fVar1 * pfVar52[2];
                      fVar102 = fVar102 + fVar1 * pfVar52[3];
                      pfVar52 = pfVar52 + 4;
                      pfVar46 = pfVar46 + lVar53;
                      iVar42 = iVar42 + -1;
                    } while (iVar42 != 0);
                  }
                  uVar31 = uVar31 + 1;
                  pfVar30 = (float *)((long)pfVar30 + lVar29);
                } while ((int)uVar31 < (int)uVar47);
              }
              fVar111 = fVar87 + fVar111 + fVar107 + fVar97;
              fVar100 = fVar94 + fVar112 + fVar108 + fVar100;
              auVar90._0_8_ = CONCAT44(fVar100,fVar111);
              auVar90._8_4_ = fVar95 + fVar113 + fVar109 + fVar101;
              auVar90._12_4_ = fVar96 + fVar114 + fVar110 + fVar102;
              fVar97 = auVar93._12_4_;
              switch(uVar9) {
              case 1:
                auVar90 = maxps(auVar90,ZEXT816(0));
                break;
              case 2:
                auVar77._8_4_ = auVar90._8_4_;
                auVar77._0_8_ = auVar90._0_8_;
                auVar77._12_4_ = auVar90._12_4_;
                auVar78 = maxps(auVar77,ZEXT816(0));
                auVar91 = minps(auVar90,ZEXT816(0));
                fVar97 = **(float **)(&this->field_0xf8 + (long)p_Var11);
                auVar90._4_4_ = fVar97 * auVar91._4_4_ + auVar78._4_4_;
                auVar90._0_4_ = fVar97 * auVar91._0_4_ + auVar78._0_4_;
                auVar90._8_4_ = fVar97 * auVar91._8_4_ + auVar78._8_4_;
                auVar90._12_4_ = fVar97 * auVar91._12_4_ + auVar78._12_4_;
                break;
              case 3:
                uVar86 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var11);
                uVar5 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var11))[1];
                auVar75._4_4_ = uVar86;
                auVar75._0_4_ = uVar86;
                auVar75._8_4_ = uVar86;
                auVar75._12_4_ = uVar86;
                auVar90 = maxps(auVar90,auVar75);
                auVar17._4_4_ = uVar5;
                auVar17._0_4_ = uVar5;
                auVar17._8_4_ = uVar5;
                auVar17._12_4_ = uVar5;
                auVar90 = minps(auVar90,auVar17);
                break;
              case 4:
                auVar89._0_8_ = CONCAT44(fVar100,fVar111) ^ 0x8000000080000000;
                auVar89._8_4_ = -auVar90._8_4_;
                auVar89._12_4_ = -auVar90._12_4_;
                auVar90 = minps(auVar89,_DAT_005488a0);
                auVar90 = maxps(auVar90,_DAT_005488b0);
                fVar101 = auVar90._0_4_ * 1.442695 + fVar103;
                fVar111 = auVar90._4_4_ * 1.442695 + fVar104;
                fVar113 = auVar90._8_4_ * 1.442695 + fVar105;
                fVar87 = auVar90._12_4_ * 1.442695 + fVar106;
                fVar100 = (float)(int)fVar101;
                fVar102 = (float)(int)fVar111;
                fVar112 = (float)(int)fVar113;
                fVar114 = (float)(int)fVar87;
                fVar100 = fVar100 - (float)(-(uint)(fVar101 < fVar100) & (uint)fVar67);
                fVar102 = fVar102 - (float)(-(uint)(fVar111 < fVar102) & (uint)fVar70);
                fVar112 = fVar112 - (float)(-(uint)(fVar113 < fVar112) & (uint)fVar71);
                fVar114 = fVar114 - (float)(-(uint)(fVar87 < fVar114) & (uint)fVar97);
                fVar101 = fVar100 * -0.6931472 + auVar90._0_4_;
                fVar111 = fVar102 * -0.6931472 + auVar90._4_4_;
                fVar113 = fVar112 * -0.6931472 + auVar90._8_4_;
                fVar87 = fVar114 * -0.6931472 + auVar90._12_4_;
                auVar76._0_4_ =
                     fVar101 + fVar67 +
                     (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) * fVar101
                       + 0.041665796) * fVar101 + 0.16666666) * fVar101 + fVar103) *
                     fVar101 * fVar101;
                auVar76._4_4_ =
                     fVar111 + fVar70 +
                     (((((fVar111 * 0.00019875691 + 0.0013981999) * fVar111 + 0.008333452) * fVar111
                       + 0.041665796) * fVar111 + 0.16666666) * fVar111 + fVar104) *
                     fVar111 * fVar111;
                auVar76._8_4_ =
                     fVar113 + fVar71 +
                     (((((fVar113 * 0.00019875691 + 0.0013981999) * fVar113 + 0.008333452) * fVar113
                       + 0.041665796) * fVar113 + 0.16666666) * fVar113 + fVar105) *
                     fVar113 * fVar113;
                auVar76._12_4_ =
                     fVar87 + fVar97 +
                     (((((fVar87 * 0.00019875691 + 0.0013981999) * fVar87 + 0.008333452) * fVar87 +
                       0.041665796) * fVar87 + 0.16666666) * fVar87 + fVar106) * fVar87 * fVar87;
                fVar113 = (float)((int)fVar100 * 0x800000 + (int)fVar67) * auVar76._0_4_ + fVar67;
                fVar87 = (float)((int)fVar102 * 0x800000 + (int)fVar70) * auVar76._4_4_ + fVar70;
                fVar112 = (float)((int)fVar112 * 0x800000 + (int)fVar71) * auVar76._8_4_ + fVar71;
                fVar114 = (float)((int)fVar114 * 0x800000 + (int)fVar97) * auVar76._12_4_ + fVar97;
                auVar16._4_4_ = fVar87;
                auVar16._0_4_ = fVar113;
                auVar16._8_4_ = fVar112;
                auVar16._12_4_ = fVar114;
                auVar90 = rcpps(auVar76,auVar16);
                fVar100 = auVar90._0_4_;
                fVar101 = auVar90._4_4_;
                fVar102 = auVar90._8_4_;
                fVar111 = auVar90._12_4_;
                auVar90._0_4_ = (fVar67 - fVar113 * fVar100) * fVar100 + fVar100;
                auVar90._4_4_ = (fVar70 - fVar87 * fVar101) * fVar101 + fVar101;
                auVar90._8_4_ = (fVar71 - fVar112 * fVar102) * fVar102 + fVar102;
                auVar90._12_4_ = (fVar97 - fVar114 * fVar111) * fVar111 + fVar111;
                break;
              case 5:
                auVar72._8_4_ = auVar90._8_4_;
                auVar72._0_8_ = auVar90._0_8_;
                auVar72._12_4_ = auVar90._12_4_;
                auVar78 = minps(auVar72,_DAT_005488a0);
                auVar78 = maxps(auVar78,_DAT_005488b0);
                fVar101 = auVar78._0_4_ * 1.442695 + fVar103;
                fVar102 = auVar78._4_4_ * 1.442695 + fVar104;
                fVar112 = auVar78._8_4_ * 1.442695 + fVar105;
                fVar113 = auVar78._12_4_ * 1.442695 + fVar106;
                fVar114 = (float)(int)fVar101;
                fVar87 = (float)(int)fVar102;
                fVar94 = (float)(int)fVar112;
                fVar95 = (float)(int)fVar113;
                fVar114 = fVar114 - (float)(-(uint)(fVar101 < fVar114) & (uint)fVar67);
                fVar87 = fVar87 - (float)(-(uint)(fVar102 < fVar87) & (uint)fVar70);
                fVar94 = fVar94 - (float)(-(uint)(fVar112 < fVar94) & (uint)fVar71);
                fVar95 = fVar95 - (float)(-(uint)(fVar113 < fVar95) & (uint)fVar97);
                fVar101 = auVar78._0_4_ - fVar114 * 0.6931472;
                fVar102 = auVar78._4_4_ - fVar87 * 0.6931472;
                fVar112 = auVar78._8_4_ - fVar94 * 0.6931472;
                fVar113 = auVar78._12_4_ - fVar95 * 0.6931472;
                auVar98._0_4_ =
                     (float)((int)fVar114 * 0x800000 + (int)fVar67) *
                     (fVar101 + fVar67 +
                     (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) * fVar101
                       + 0.041665796) * fVar101 + 0.16666666) * fVar101 + fVar103) *
                     fVar101 * fVar101) + fVar67;
                auVar98._4_4_ =
                     (float)((int)fVar87 * 0x800000 + (int)fVar70) *
                     (fVar102 + fVar70 +
                     (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102
                       + 0.041665796) * fVar102 + 0.16666666) * fVar102 + fVar104) *
                     fVar102 * fVar102) + fVar70;
                auVar98._8_4_ =
                     (float)((int)fVar94 * 0x800000 + (int)fVar71) *
                     (fVar112 + fVar71 +
                     (((((fVar112 * 0.00019875691 + 0.0013981999) * fVar112 + 0.008333452) * fVar112
                       + 0.041665796) * fVar112 + 0.16666666) * fVar112 + fVar105) *
                     fVar112 * fVar112) + fVar71;
                auVar98._12_4_ =
                     (float)((int)fVar95 * 0x800000 + (int)fVar97) *
                     (fVar113 + fVar97 +
                     (((((fVar113 * 0.00019875691 + 0.0013981999) * fVar113 + 0.008333452) * fVar113
                       + 0.041665796) * fVar113 + 0.16666666) * fVar113 + fVar106) *
                     fVar113 * fVar113) + fVar97;
                auVar78 = maxps(auVar98,_DAT_00548950);
                auVar99._0_8_ = auVar78._0_8_ & 0x807fffff807fffff;
                auVar99._8_4_ = auVar78._8_4_ & 0x807fffff;
                auVar99._12_4_ = auVar78._12_4_ & 0x807fffff;
                auVar99 = auVar99 | auVar92;
                fVar101 = auVar99._0_4_;
                fVar112 = auVar99._4_4_;
                fVar114 = auVar99._8_4_;
                fVar94 = auVar99._12_4_;
                fVar102 = fVar101 + -1.0 + (float)(-(uint)(fVar101 < 0.70710677) & (uint)fVar101);
                fVar113 = fVar112 + -1.0 + (float)(-(uint)(fVar112 < 0.70710677) & (uint)fVar112);
                fVar87 = fVar114 + -1.0 + (float)(-(uint)(fVar114 < 0.70710677) & (uint)fVar114);
                fVar95 = fVar94 + -1.0 + (float)(-(uint)(fVar94 < 0.70710677) & (uint)fVar94);
                auVar73._0_8_ =
                     CONCAT44(-(uint)(auVar98._4_4_ <= 0.0),-(uint)(auVar98._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar73._8_4_ = -(uint)(auVar98._8_4_ <= 0.0) & 0x7fffffff;
                auVar73._12_4_ = -(uint)(auVar98._12_4_ <= 0.0) & 0x7fffffff;
                auVar91._4_4_ =
                     ~-(uint)(auVar98._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar78._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar112 < 0.70710677) & (uint)fVar70)) * 0.6931472 +
                             fVar113 +
                            (((((((((fVar113 * 0.070376836 + -0.1151461) * fVar113 + 0.116769984) *
                                   fVar113 + -0.12420141) * fVar113 + 0.14249323) * fVar113 +
                                -0.16668057) * fVar113 + 0.20000714) * fVar113 + -0.24999994) *
                              fVar113 + 0.3333333) * fVar113 + -0.5) * fVar113 * fVar113) * -2.0);
                auVar91._0_4_ =
                     ~-(uint)(auVar98._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar78._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar101 < 0.70710677) & (uint)fVar67)) * 0.6931472 +
                             fVar102 +
                            (((((((((fVar102 * 0.070376836 + -0.1151461) * fVar102 + 0.116769984) *
                                   fVar102 + -0.12420141) * fVar102 + 0.14249323) * fVar102 +
                                -0.16668057) * fVar102 + 0.20000714) * fVar102 + -0.24999994) *
                              fVar102 + 0.3333333) * fVar102 + -0.5) * fVar102 * fVar102) * -2.0);
                auVar91._8_4_ =
                     ~-(uint)(auVar98._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar78._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar114 < 0.70710677) & (uint)fVar71)) * 0.6931472 +
                             fVar87 + (((((((((fVar87 * 0.070376836 + -0.1151461) * fVar87 +
                                             0.116769984) * fVar87 + -0.12420141) * fVar87 +
                                           0.14249323) * fVar87 + -0.16668057) * fVar87 + 0.20000714
                                         ) * fVar87 + -0.24999994) * fVar87 + 0.3333333) * fVar87 +
                                      -0.5) * fVar87 * fVar87) * -2.0);
                auVar91._12_4_ =
                     ~-(uint)(auVar98._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar78._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar94 < 0.70710677) & (uint)fVar97)) * 0.6931472 +
                             fVar95 + (((((((((fVar95 * 0.070376836 + -0.1151461) * fVar95 +
                                             0.116769984) * fVar95 + -0.12420141) * fVar95 +
                                           0.14249323) * fVar95 + -0.16668057) * fVar95 + 0.20000714
                                         ) * fVar95 + -0.24999994) * fVar95 + 0.3333333) * fVar95 +
                                      -0.5) * fVar95 * fVar95) * -2.0);
                auVar78 = minps(auVar73 | auVar91,_DAT_005488a0);
                auVar78 = maxps(auVar78,_DAT_005488b0);
                fVar101 = auVar78._0_4_ * 1.442695 + fVar103;
                fVar102 = auVar78._4_4_ * 1.442695 + fVar104;
                fVar112 = auVar78._8_4_ * 1.442695 + fVar105;
                fVar113 = auVar78._12_4_ * 1.442695 + fVar106;
                fVar114 = (float)(int)fVar101;
                fVar87 = (float)(int)fVar102;
                fVar94 = (float)(int)fVar112;
                fVar95 = (float)(int)fVar113;
                fVar114 = fVar114 - (float)(-(uint)(fVar101 < fVar114) & (uint)fVar67);
                fVar87 = fVar87 - (float)(-(uint)(fVar102 < fVar87) & (uint)fVar70);
                fVar94 = fVar94 - (float)(-(uint)(fVar112 < fVar94) & (uint)fVar71);
                fVar95 = fVar95 - (float)(-(uint)(fVar113 < fVar95) & (uint)fVar97);
                fVar101 = auVar78._0_4_ - fVar114 * 0.6931472;
                fVar102 = auVar78._4_4_ - fVar87 * 0.6931472;
                fVar112 = auVar78._8_4_ - fVar94 * 0.6931472;
                fVar113 = auVar78._12_4_ - fVar95 * 0.6931472;
                auVar74._0_4_ =
                     fVar101 + fVar67 +
                     (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) * fVar101
                       + 0.041665796) * fVar101 + 0.16666666) * fVar101 + fVar103) *
                     fVar101 * fVar101;
                auVar74._4_4_ =
                     fVar102 + fVar70 +
                     (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102
                       + 0.041665796) * fVar102 + 0.16666666) * fVar102 + fVar104) *
                     fVar102 * fVar102;
                auVar74._8_4_ =
                     fVar112 + fVar71 +
                     (((((fVar112 * 0.00019875691 + 0.0013981999) * fVar112 + 0.008333452) * fVar112
                       + 0.041665796) * fVar112 + 0.16666666) * fVar112 + fVar105) *
                     fVar112 * fVar112;
                auVar74._12_4_ =
                     fVar113 + fVar97 +
                     (((((fVar113 * 0.00019875691 + 0.0013981999) * fVar113 + 0.008333452) * fVar113
                       + 0.041665796) * fVar113 + 0.16666666) * fVar113 + fVar106) *
                     fVar113 * fVar113;
                fVar114 = (float)((int)fVar114 * 0x800000 + (int)fVar67) * auVar74._0_4_ + fVar67;
                fVar87 = (float)((int)fVar87 * 0x800000 + (int)fVar70) * auVar74._4_4_ + fVar70;
                fVar94 = (float)((int)fVar94 * 0x800000 + (int)fVar71) * auVar74._8_4_ + fVar71;
                fVar97 = (float)((int)fVar95 * 0x800000 + (int)fVar97) * auVar74._12_4_ + fVar97;
                auVar19._4_4_ = fVar87;
                auVar19._0_4_ = fVar114;
                auVar19._8_4_ = fVar94;
                auVar19._12_4_ = fVar97;
                auVar78 = rcpps(auVar74,auVar19);
                fVar101 = auVar78._0_4_;
                fVar102 = auVar78._4_4_;
                fVar112 = auVar78._8_4_;
                fVar113 = auVar78._12_4_;
                auVar90._0_4_ =
                     fVar111 * (fVar101 + fVar101 + -1.0 +
                               (2.0 - fVar114 * (fVar101 + fVar101)) * fVar101);
                auVar90._4_4_ =
                     fVar100 * (fVar102 + fVar102 + -1.0 +
                               (2.0 - fVar87 * (fVar102 + fVar102)) * fVar102);
                auVar90._8_4_ =
                     auVar90._8_4_ *
                     (fVar112 + fVar112 + -1.0 + (2.0 - fVar94 * (fVar112 + fVar112)) * fVar112);
                auVar90._12_4_ =
                     auVar90._12_4_ *
                     (fVar113 + fVar113 + -1.0 + (2.0 - fVar97 * (fVar113 + fVar113)) * fVar113);
                break;
              case 6:
                fVar97 = **(float **)(&this->field_0xf8 + (long)p_Var11);
                fVar101 = (*(float **)(&this->field_0xf8 + (long)p_Var11))[1];
                auVar78._0_4_ = fVar97 * fVar111 + fVar101;
                auVar78._4_4_ = fVar97 * fVar100 + fVar101;
                auVar78._8_4_ = fVar97 * auVar90._8_4_ + fVar101;
                auVar78._12_4_ = fVar97 * auVar90._12_4_ + fVar101;
                auVar78 = maxps(auVar78,ZEXT816(0));
                auVar78 = minps(auVar78,auVar93);
                auVar90._0_4_ = fVar111 * auVar78._0_4_;
                auVar90._4_4_ = fVar100 * auVar78._4_4_;
                auVar90._8_4_ = auVar90._8_4_ * auVar78._8_4_;
                auVar90._12_4_ = auVar90._12_4_ * auVar78._12_4_;
              }
              if (iVar33 == 1) {
                *(int *)*local_1c0 = auVar90._0_4_;
                *(int *)((long)*local_1c0 + lVar48 * 4) = auVar90._4_4_;
                *(int *)((long)*local_1c0 + (long)(iVar26 * 2) * 4) = auVar90._8_4_;
                *(int *)((long)*local_1c0 + lVar27 * 4) = auVar90._12_4_;
                local_1c0 = (undefined1 (*) [16])((long)*local_1c0 + 4);
              }
              else if (iVar33 == 4) {
                *local_1c0 = auVar90;
                local_1c0 = local_1c0 + 1;
              }
              lVar55 = lVar55 + 1;
              iVar44 = iVar44 + iVar41 * local_f8.elempack;
              local_198 = local_198 + lVar38 * 4;
              local_1b8 = local_1b8 + lVar38 * 4;
            } while (lVar55 != lVar28);
          }
          local_1e8 = local_1e8 + 1;
        } while (local_1e8 != uVar43);
      }
      iVar26 = iVar50 + uVar43 * -4;
      local_70 = (ulong)(uint)(iVar26 / 2);
      if (1 < iVar26) {
        uVar45 = local_f8.h * local_f8.elempack;
        uVar47 = top_blob->w;
        local_40 = top_blob->data;
        local_48 = (long)(int)uVar47 * top_blob->elemsize;
        iVar26 = iVar41 * local_f8.elempack;
        local_50 = (this->weight_data_tm).elemsize * (this->weight_data_tm).cstep;
        local_58 = (this->weight_data_tm).data;
        bVar58 = local_f8.elempack == 1;
        local_60 = (long)(int)(uVar43 * 4);
        local_68 = lVar40 * 4;
        local_110 = 0;
        local_38 = local_70;
        do {
          if (0 < (int)uVar47) {
            lVar27 = local_60 + local_110 * 2;
            puVar49 = (undefined4 *)((local_60 + local_110 * 2 + 1) * local_48 + (long)local_40);
            puVar51 = (undefined4 *)(lVar27 * local_48 + (long)local_40);
            uVar59 = (uint)lVar27;
            uVar60 = uVar59 + 3;
            if (-1 < (int)uVar59) {
              uVar60 = uVar59;
            }
            pfVar30 = (float *)((((int)(uVar59 - (uVar60 & 0xfffffffc)) >> 1) + ((int)uVar60 >> 2))
                                * local_50 + (long)local_58);
            lVar48 = (long)local_f8.w *
                     CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
            pfVar52 = *(float **)(&this->field_0xf8 + (long)p_Var11);
            local_1a8 = local_68 + (long)local_f8.data;
            iVar33 = 0;
            local_88._0_8_ = local_f8.data;
            local_1d0 = local_f8.data;
            local_1e8 = 0;
            do {
              fVar67 = 0.0;
              fVar70 = 0.0;
              fVar71 = 0.0;
              fVar103 = 0.0;
              uVar88 = 0;
              if (lVar12 != 0) {
                uVar88 = *(undefined8 *)(lVar12 + lVar27 * 4);
              }
              uVar31 = 0;
              fVar104 = 0.0;
              fVar105 = 0.0;
              fVar106 = 0.0;
              fVar97 = 0.0;
              pfVar46 = pfVar30;
              if (3 < (int)uVar45) {
                iVar44 = 0;
                do {
                  lVar28 = (iVar44 / iVar6) * lVar48;
                  if (iVar6 == 4) {
                    if (0 < iVar7) {
                      pfVar32 = (float *)(lVar28 + (long)iVar33 * 4 + local_88._0_8_);
                      iVar42 = iVar7;
                      do {
                        fVar67 = fVar67 + *pfVar46 * *pfVar32;
                        fVar70 = fVar70 + pfVar46[1] * pfVar32[1];
                        fVar71 = fVar71 + pfVar46[2] * pfVar32[2];
                        fVar103 = fVar103 + pfVar46[3] * pfVar32[3];
                        fVar104 = fVar104 + *pfVar32 * pfVar46[4];
                        fVar105 = fVar105 + pfVar32[1] * pfVar46[5];
                        fVar106 = fVar106 + pfVar32[2] * pfVar46[6];
                        fVar97 = fVar97 + pfVar32[3] * pfVar46[7];
                        pfVar46 = pfVar46 + 8;
                        pfVar32 = pfVar32 + iVar8 * 4;
                        iVar42 = iVar42 + -1;
                      } while (iVar42 != 0);
                      goto LAB_004e2895;
                    }
                  }
                  else {
                    pfVar32 = (float *)(lVar28 + local_88._0_8_ +
                                                 (long)(iVar26 * (int)local_1e8) * 4);
LAB_004e2895:
                    iVar42 = iVar7;
                    if (0 < iVar7 && bVar58) {
                      do {
                        fVar67 = fVar67 + *pfVar46 * *pfVar32;
                        fVar70 = fVar70 + pfVar46[1] * pfVar32[lVar40];
                        fVar71 = fVar71 + pfVar46[2] * pfVar32[iVar25 * 2];
                        fVar103 = fVar103 + pfVar46[3] * pfVar32[iVar25 * 3];
                        fVar104 = fVar104 + *pfVar32 * pfVar46[4];
                        fVar105 = fVar105 + pfVar32[lVar40] * pfVar46[5];
                        fVar106 = fVar106 + pfVar32[iVar25 * 2] * pfVar46[6];
                        fVar97 = fVar97 + pfVar32[iVar25 * 3] * pfVar46[7];
                        pfVar46 = pfVar46 + 8;
                        pfVar32 = pfVar32 + lVar53;
                        iVar42 = iVar42 + -1;
                      } while (iVar42 != 0);
                    }
                  }
                  iVar42 = iVar44 + 7;
                  iVar44 = iVar44 + 4;
                } while (iVar42 < (int)uVar45);
                uVar31 = (ulong)uVar45 & 0xfffffffc;
              }
              auVar92._0_4_ = (float)uVar88 + fVar71 + fVar67 + fVar103 + fVar70;
              auVar92._4_4_ = (float)((ulong)uVar88 >> 0x20) + fVar106 + fVar104 + fVar97 + fVar105;
              auVar92._8_4_ = fVar103 + fVar70 + 0.0 + fVar71 + fVar71;
              auVar92._12_4_ = fVar97 + fVar105 + 0.0 + fVar103 + fVar103;
              uVar59 = (uint)uVar31;
              if ((int)(uVar59 | 1) < (int)uVar45) {
                lVar28 = local_1a8 + lVar48 * uVar31;
                pvVar35 = (void *)(lVar48 * uVar31 + (long)local_1d0);
                do {
                  if (0 < iVar7) {
                    lVar55 = 0;
                    iVar44 = iVar7;
                    do {
                      fVar67 = *(float *)((long)pvVar35 + lVar55);
                      fVar71 = auVar92._4_4_;
                      fVar103 = auVar92._8_4_;
                      fVar104 = auVar92._12_4_;
                      fVar70 = *(float *)(lVar28 + lVar55);
                      auVar92._0_4_ =
                           fVar70 * (float)*(undefined8 *)(pfVar46 + 2) +
                           (float)*(undefined8 *)pfVar46 * fVar67 + auVar92._0_4_;
                      auVar92._4_4_ =
                           fVar70 * (float)((ulong)*(undefined8 *)(pfVar46 + 2) >> 0x20) +
                           (float)((ulong)*(undefined8 *)pfVar46 >> 0x20) * fVar67 + fVar71;
                      auVar92._8_4_ = fVar70 * 0.0 + fVar67 * 0.0 + fVar103;
                      auVar92._12_4_ = fVar70 * 0.0 + fVar67 * 0.0 + fVar104;
                      pfVar46 = pfVar46 + 4;
                      lVar55 = lVar55 + lVar53 * 4;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  uVar31 = uVar31 + 2;
                  uVar59 = (uint)uVar31;
                  lVar28 = lVar28 + lVar48 * 2;
                  pvVar35 = (void *)((long)pvVar35 + lVar48 * 2);
                } while ((int)(uVar59 | 1) < (int)uVar45);
              }
              if ((int)uVar59 < (int)uVar45) {
                uVar31 = (ulong)uVar59;
                pfVar32 = (float *)(lVar48 * uVar31 + (long)local_1d0);
                do {
                  pfVar39 = pfVar32;
                  auVar93 = auVar92;
                  iVar44 = iVar7;
                  if (0 < iVar7) {
                    do {
                      fVar67 = *pfVar39;
                      auVar92._0_4_ = auVar93._0_4_ + fVar67 * (float)*(undefined8 *)pfVar46;
                      auVar92._4_4_ =
                           auVar93._4_4_ + fVar67 * (float)((ulong)*(undefined8 *)pfVar46 >> 0x20);
                      auVar92._8_4_ = auVar93._8_4_ + fVar67 * 0.0;
                      auVar92._12_4_ = auVar93._12_4_ + fVar67 * 0.0;
                      pfVar46 = pfVar46 + 2;
                      pfVar39 = pfVar39 + lVar53;
                      iVar44 = iVar44 + -1;
                      auVar93 = auVar92;
                    } while (iVar44 != 0);
                  }
                  uVar31 = uVar31 + 1;
                  pfVar32 = (float *)((long)pfVar32 + lVar48);
                } while ((int)uVar31 < (int)uVar45);
              }
              uVar31 = auVar92._0_8_;
              fVar67 = auVar92._0_4_;
              fVar70 = auVar92._4_4_;
              fVar71 = auVar92._8_4_;
              fVar103 = auVar92._12_4_;
              auVar93._4_12_ = auVar92._4_12_;
              switch(uVar9) {
              case 1:
                auVar92 = maxps(auVar92,_DAT_00546030);
                uVar31 = auVar92._0_8_;
                break;
              case 2:
                fVar104 = *pfVar52;
                auVar80._0_4_ = ~-(uint)(0.0 < fVar67) & (uint)fVar104;
                auVar80._4_4_ = ~-(uint)(0.0 < fVar70) & (uint)fVar104;
                auVar80._8_4_ = ~-(uint)(0.0 < fVar71) & (uint)fVar104;
                auVar80._12_4_ = ~-(uint)(0.0 < fVar103) & (uint)fVar104;
                auVar65._0_8_ =
                     CONCAT44(-(uint)(0.0 < fVar70),-(uint)(0.0 < fVar67)) & 0x3f8000003f800000;
                auVar65._8_8_ = 0;
                uVar31 = CONCAT44(fVar70 * SUB164(auVar65 | auVar80,4),
                                  fVar67 * SUB164(auVar65 | auVar80,0));
                break;
              case 3:
                uVar31 = *(ulong *)pfVar52;
                fVar104 = (float)uVar31;
                fVar105 = (float)(uVar31 >> 0x20);
                if (fVar104 <= fVar67) {
                  uVar31 = (ulong)(uint)fVar67;
                }
                uVar59 = -(uint)(fVar105 < (float)uVar31);
                auVar83._0_4_ = ~-(uint)(fVar70 < fVar104) & (uint)fVar70;
                auVar83._4_4_ = ~uVar59 & (uint)(float)uVar31;
                auVar83._8_4_ = ~-(uint)(fVar71 < 0.0) & (uint)fVar71;
                auVar83._12_4_ = ~-(uint)(fVar103 < 0.0) & (uint)fVar103;
                auVar18._4_4_ = (uint)fVar105 & uVar59;
                auVar18._0_4_ = (uint)fVar104 & -(uint)(fVar70 < fVar104);
                auVar18._8_8_ = 0;
                fVar67 = SUB164(auVar83 | auVar18,0);
                uVar86 = SUB164(auVar83 | auVar18,4);
                uVar31 = CONCAT44(fVar67,uVar86);
                if (fVar105 < fVar67) {
                  uVar31 = CONCAT44(fVar105,uVar86);
                }
                break;
              case 4:
                auVar92 = minps(auVar92,_DAT_00549510);
                uVar59 = -(uint)(auVar92._0_4_ < -88.37626);
                uVar60 = -(uint)(auVar92._4_4_ < -88.37626);
                uVar61 = -(uint)(auVar92._8_4_ < 0.0);
                uVar62 = -(uint)(auVar92._12_4_ < 0.0);
                auVar63._0_4_ = (uint)DAT_00549510 & uVar59;
                auVar63._4_4_ = DAT_00549510._4_4_ & uVar60;
                auVar63._8_4_ = DAT_00549510._8_4_ & uVar61;
                auVar63._12_4_ = DAT_00549510._12_4_ & uVar62;
                auVar68._0_4_ = ~uVar59 & (uint)-auVar92._0_4_;
                auVar68._4_4_ = ~uVar60 & (uint)-auVar92._4_4_;
                auVar68._8_4_ = ~uVar61 & (uint)-auVar92._8_4_;
                auVar68._12_4_ = ~uVar62 & (uint)-auVar92._12_4_;
                _local_98 = auVar68 | auVar63;
                local_a8._0_4_ = expf(local_98._0_4_);
                local_a8._4_4_ = extraout_XMM0_Db_00;
                uStack_a0 = extraout_XMM0_Dc_00;
                uStack_9c = extraout_XMM0_Dd_00;
                auVar64._0_4_ = expf((float)local_98._4_4_);
                auVar64._4_12_ = extraout_var;
                auVar79._0_4_ = (float)local_a8._0_4_ + 1.0;
                auVar79._4_4_ = auVar64._0_4_ + 1.0;
                auVar79._8_4_ = (float)local_a8._4_4_ + 0.0;
                auVar79._12_4_ = extraout_var._0_4_ + 0.0;
                auVar92 = rcpps(auVar64,auVar79);
                fVar67 = auVar92._0_4_;
                fVar70 = auVar92._4_4_;
                uVar31 = CONCAT44((1.0 - auVar79._4_4_ * fVar70) * fVar70 + fVar70,
                                  (1.0 - auVar79._0_4_ * fVar67) * fVar67 + fVar67);
                break;
              case 5:
                _local_a8 = auVar92;
                fVar67 = expf(fVar67);
                fVar67 = logf(fVar67 + 1.0);
                local_98._0_4_ = tanhf(fVar67);
                local_98._4_4_ = extraout_XMM0_Db;
                uStack_90 = extraout_XMM0_Dc;
                uStack_8c = extraout_XMM0_Dd;
                fVar67 = expf((float)local_a8._4_4_);
                fVar67 = logf(fVar67 + 1.0);
                fVar67 = tanhf(fVar67);
                uVar31 = CONCAT44((float)local_a8._4_4_ * fVar67,
                                  (float)local_a8._0_4_ * local_98._0_4_);
                break;
              case 6:
                fVar71 = *pfVar52;
                fVar103 = pfVar52[1];
                fVar105 = -fVar103 / fVar71;
                fVar104 = 0.0;
                if ((fVar105 <= fVar67) && (fVar104 = fVar67, fVar67 <= 1.0 / fVar71 + fVar105)) {
                  fVar104 = (fVar71 * fVar67 + fVar103) * fVar67;
                }
                if (fVar105 <= fVar70) {
                  auVar93._0_4_ = fVar104;
                  uVar31 = auVar93._0_8_;
                  if (fVar70 <= fVar105 + 1.0 / fVar71) {
                    uVar31 = CONCAT44((fVar71 * fVar70 + fVar103) * fVar70,fVar104);
                  }
                }
                else {
                  uVar31 = (ulong)(uint)fVar104;
                }
              }
              *puVar51 = (int)uVar31;
              *puVar49 = (int)(uVar31 >> 0x20);
              puVar51 = puVar51 + 1;
              puVar49 = puVar49 + 1;
              local_1e8 = local_1e8 + 1;
              iVar33 = iVar33 + iVar26;
              local_1a8 = local_1a8 + lVar38 * 4;
              local_1d0 = (void *)((long)local_1d0 + lVar38 * 4);
            } while (local_1e8 != uVar47);
          }
          local_110 = local_110 + 1;
        } while (local_110 != local_38);
      }
      iVar26 = uVar43 * 4 + (int)local_70 * 2;
      if (iVar26 < iVar50) {
        pvVar35 = top_blob->data;
        iVar50 = top_blob->w;
        sVar13 = top_blob->elemsize;
        local_a8 = (undefined1  [8])(this->weight_data_tm).data;
        sVar14 = (this->weight_data_tm).elemsize;
        sVar15 = (this->weight_data_tm).cstep;
        local_1a8 = (ulong)iVar26;
        local_98 = (undefined1  [8])(lVar40 * 4);
        do {
          pvVar22 = local_f8.data;
          if (0 < (int)uVar10) {
            puVar51 = (undefined4 *)((long)iVar50 * sVar13 * local_1a8 + (long)pvVar35);
            iVar26 = (int)local_1a8;
            iVar33 = iVar26 + 3;
            if (-1 < iVar26) {
              iVar33 = iVar26;
            }
            pfVar30 = (float *)((long)(int)((iVar26 - (((uint)(local_1a8 >> 0x1f) & 1) + iVar26 &
                                                      0xfffffffe)) + (iVar33 >> 2) +
                                           (int)((char)((char)local_1a8 - ((byte)iVar33 & 0xfc)) /
                                                '\x02')) * sVar14 * sVar15 + (long)local_a8);
            lVar27 = (long)local_f8.w *
                     CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
            pfVar52 = *(float **)(&this->field_0xf8 + (long)p_Var11);
            local_1d8 = (long)local_98 + (long)local_f8.data;
            iVar26 = 0;
            local_1c0 = (undefined1 (*) [16])local_f8.data;
            local_198 = 0;
            do {
              if (lVar12 == 0) {
                fVar67 = 0.0;
              }
              else {
                fVar67 = *(float *)(lVar12 + local_1a8 * 4);
              }
              pfVar46 = pfVar30;
              if ((int)uVar24 < 4) {
                uVar31 = 0;
                auVar69 = ZEXT816(0);
              }
              else {
                auVar69 = ZEXT816(0);
                iVar33 = 0;
                do {
                  lVar48 = (iVar33 / iVar6) * lVar27;
                  if (iVar6 == 4 && 0 < iVar7) {
                    pfVar32 = (float *)((long)pvVar22 + lVar48 + (long)iVar26 * 4);
                    auVar92 = auVar69;
                    iVar44 = iVar7;
                    do {
                      auVar69._0_4_ = auVar92._0_4_ + *pfVar46 * *pfVar32;
                      auVar69._4_4_ = auVar92._4_4_ + pfVar46[1] * pfVar32[1];
                      auVar69._8_4_ = auVar92._8_4_ + pfVar46[2] * pfVar32[2];
                      auVar69._12_4_ = auVar92._12_4_ + pfVar46[3] * pfVar32[3];
                      pfVar46 = pfVar46 + 4;
                      pfVar32 = pfVar32 + iVar8 * 4;
                      iVar44 = iVar44 + -1;
                      auVar92 = auVar69;
                    } while (iVar44 != 0);
                  }
                  else {
                    pfVar32 = (float *)((long)pvVar22 +
                                       lVar48 + (long)(iVar6 * iVar41 * (int)local_198) * 4);
                  }
                  auVar92 = auVar69;
                  iVar44 = iVar7;
                  if (iVar6 == 1 && 0 < iVar7) {
                    do {
                      auVar69._0_4_ = auVar92._0_4_ + *pfVar32 * *pfVar46;
                      auVar69._4_4_ = auVar92._4_4_ + pfVar32[lVar40] * pfVar46[1];
                      auVar69._8_4_ = auVar92._8_4_ + pfVar32[iVar25 * 2] * pfVar46[2];
                      auVar69._12_4_ = auVar92._12_4_ + pfVar32[iVar25 * 3] * pfVar46[3];
                      pfVar46 = pfVar46 + 4;
                      pfVar32 = pfVar32 + lVar53;
                      iVar44 = iVar44 + -1;
                      auVar92 = auVar69;
                    } while (iVar44 != 0);
                  }
                  iVar44 = iVar33 + 7;
                  iVar33 = iVar33 + 4;
                } while (iVar44 < (int)uVar24);
                uVar31 = (ulong)uVar24 & 0xfffffffc;
              }
              auVar81._4_4_ = auVar69._12_4_ + auVar69._4_4_;
              auVar81._0_4_ = auVar81._4_4_;
              auVar81._8_4_ = auVar81._4_4_;
              auVar81._12_4_ = auVar81._4_4_;
              auVar82._4_12_ = auVar81._4_12_;
              auVar82._0_4_ = auVar81._4_4_ + fVar67 + auVar69._8_4_ + auVar69._0_4_;
              uVar43 = (uint)uVar31;
              if ((int)(uVar43 | 1) < (int)uVar24) {
                lVar48 = local_1d8 + lVar27 * uVar31;
                pvVar36 = (void *)(lVar27 * uVar31 + (long)local_1c0);
                do {
                  auVar85 = auVar82;
                  if (0 < iVar7) {
                    lVar28 = 0;
                    iVar33 = iVar7;
                    do {
                      auVar84._4_4_ =
                           *(float *)(lVar48 + lVar28) *
                           (float)((ulong)*(undefined8 *)pfVar46 >> 0x20);
                      auVar84._0_4_ = auVar84._4_4_;
                      auVar84._8_4_ = auVar84._4_4_;
                      auVar84._12_4_ = auVar84._4_4_;
                      auVar85._4_12_ = auVar84._4_12_;
                      auVar85._0_4_ =
                           auVar84._4_4_ +
                           auVar82._0_4_ +
                           *(float *)((long)pvVar36 + lVar28) * (float)*(undefined8 *)pfVar46;
                      pfVar46 = pfVar46 + 2;
                      lVar28 = lVar28 + lVar53 * 4;
                      auVar82._4_4_ = auVar84._4_4_;
                      auVar82._0_4_ = auVar85._0_4_;
                      auVar82._8_4_ = auVar84._4_4_;
                      auVar82._12_4_ = auVar84._4_4_;
                      iVar33 = iVar33 + -1;
                    } while (iVar33 != 0);
                  }
                  auVar82 = auVar85;
                  uVar31 = uVar31 + 2;
                  uVar43 = (uint)uVar31;
                  lVar48 = lVar48 + lVar27 * 2;
                  pvVar36 = (void *)((long)pvVar36 + lVar27 * 2);
                } while ((int)(uVar43 | 1) < (int)uVar24);
              }
              else {
                auVar82._4_4_ = auVar81._4_4_;
                auVar82._8_4_ = auVar81._4_4_;
                auVar82._12_4_ = auVar81._4_4_;
              }
              if ((int)uVar43 < (int)uVar24) {
                uVar31 = (ulong)uVar43;
                pfVar32 = (float *)(lVar27 * uVar31 + (long)local_1c0);
                do {
                  pfVar39 = pfVar32;
                  iVar33 = iVar7;
                  if (0 < iVar7) {
                    do {
                      auVar82._0_4_ = auVar82._0_4_ + *pfVar46 * *pfVar39;
                      pfVar46 = pfVar46 + 1;
                      pfVar39 = pfVar39 + lVar53;
                      iVar33 = iVar33 + -1;
                    } while (iVar33 != 0);
                  }
                  uVar31 = uVar31 + 1;
                  pfVar32 = (float *)((long)pfVar32 + lVar27);
                } while ((int)uVar31 < (int)uVar24);
              }
              fVar67 = auVar82._0_4_;
              auVar66 = auVar82;
              switch(uVar9) {
              case 1:
                if (fVar67 <= 0.0) {
                  auVar20._12_4_ = 0;
                  auVar20._0_12_ = auVar82._4_12_;
                  auVar66 = auVar20 << 0x20;
                }
                break;
              case 2:
                auVar66 = ZEXT416((uint)((float)(~-(uint)(0.0 < fVar67) & (uint)*pfVar52 |
                                                -(uint)(0.0 < fVar67) & 0x3f800000) * fVar67));
                break;
              case 3:
                if (fVar67 <= *pfVar52) {
                  auVar82._0_4_ = *pfVar52;
                }
                fVar67 = pfVar52[1];
                auVar66 = auVar82;
                if (fVar67 < auVar82._0_4_) {
LAB_004e3221:
                  auVar66 = ZEXT416((uint)fVar67);
                }
                break;
              case 4:
                if (88.37626 <= fVar67) {
                  fVar67 = 88.37626;
                }
                fVar67 = expf((float)(-(uint)(fVar67 < -88.37626) & 0x42b0c0a5 |
                                     ~-(uint)(fVar67 < -88.37626) & (uint)-fVar67));
                auVar66 = ZEXT416((uint)(1.0 / (fVar67 + 1.0)));
                break;
              case 5:
                local_88 = auVar82;
                fVar67 = expf(fVar67);
                fVar67 = logf(fVar67 + 1.0);
                fVar67 = tanhf(fVar67);
                auVar66._0_4_ = fVar67 * (float)local_88._0_4_;
                auVar66._4_12_ = extraout_var_00;
                break;
              case 6:
                fVar70 = *pfVar52;
                fVar71 = -pfVar52[1] / fVar70;
                auVar66 = ZEXT816(0);
                if ((fVar71 <= fVar67) && (auVar66 = auVar82, fVar67 <= fVar71 + 1.0 / fVar70)) {
                  fVar67 = (fVar70 * fVar67 + pfVar52[1]) * fVar67;
                  goto LAB_004e3221;
                }
              }
              *puVar51 = auVar66._0_4_;
              puVar51 = puVar51 + 1;
              local_198 = local_198 + 1;
              iVar26 = iVar26 + iVar41 * iVar6;
              local_1d8 = local_1d8 + lVar38 * 4;
              local_1c0 = (undefined1 (*) [16])((long)local_1c0 + lVar38 * 4);
            } while (local_198 != uVar10);
          }
          local_1a8 = local_1a8 + 1;
        } while (local_1a8 != uVar34);
      }
      iVar41 = 0;
    }
  }
  piVar21 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
  if (piVar21 != (int *)0x0) {
    LOCK();
    *piVar21 = *piVar21 + -1;
    UNLOCK();
    if (*piVar21 == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        if (local_f8.data != (void *)0x0) {
          free(local_f8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_f8.allocator + 0x18))();
      }
    }
  }
  return iVar41;
}

Assistant:

int Convolution1D_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    convolution1d_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, dilation_w, stride_w, activation_type, activation_params, opt);

    return 0;
}